

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFrames(Abc_Ntk_t *pNtk,int nFrames,int fInitial,int fVerbose)

{
  Abc_Aig_t *pMan;
  void **ppvVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  ProgressBar *p;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  char Buffer_1 [10];
  char Buffer [1000];
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x30e,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x30f,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  iVar2 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x310,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->nObjCounts[8] == pNtk->vBoxes->nSize) {
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    iVar2 = 0;
    sprintf(Buffer,"%s_%d_frames",pNtk->pName,(ulong)(uint)nFrames);
    pcVar4 = Extra_UtilStrsav(Buffer);
    pNtk_00->pName = pcVar4;
    pAVar5 = Abc_AigConst1(pNtk_00);
    pAVar6 = Abc_AigConst1(pNtk);
    (pAVar6->field_6).pCopy = pAVar5;
    if (fInitial == 0) {
      for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar2);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          Abc_NtkDupBox(pNtk_00,pAVar5,1);
        }
      }
    }
    else {
      uVar9 = 0;
      for (; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar2);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          pAVar6 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
          if (((pAVar5->field_5).pData == (void *)0x3) || ((pAVar5->field_5).pData == (void *)0x0))
          {
            pAVar5 = Abc_NtkCreatePi(pNtk_00);
            (pAVar6->field_6).pCopy = pAVar5;
            pcVar4 = Abc_ObjName(pAVar6);
            Abc_ObjAssignName(pAVar5,pcVar4,(char *)0x0);
            uVar9 = uVar9 + 1;
          }
          else {
            pAVar7 = Abc_AigConst1(pNtk_00);
            if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                            ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
            }
            (pAVar6->field_6).pTemp =
                 (void *)((ulong)((pAVar5->field_5).pData == (void *)0x1) ^ (ulong)pAVar7);
          }
        }
      }
      if (uVar9 != 0) {
        printf("Warning: %d uninitialized latches are replaced by free PI variables.\n",(ulong)uVar9
              );
      }
    }
    p = Extra_ProgressBarStart(_stdout,nFrames);
    uVar8 = 0;
    while (iVar2 = (int)uVar8, iVar2 != nFrames) {
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= iVar2)) {
        Extra_ProgressBarUpdate_int(p,iVar2,(char *)0x0);
      }
      sprintf(Buffer_1,"_%02d",uVar8);
      for (iVar10 = 0; iVar10 < pNtk->vPis->nSize; iVar10 = iVar10 + 1) {
        pAVar5 = Abc_NtkPi(pNtk,iVar10);
        pAVar6 = Abc_NtkDupObj(pNtk_00,pAVar5,0);
        pcVar4 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar6,pcVar4,Buffer_1);
      }
      for (iVar10 = 0; iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar10);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          iVar3 = Abc_AigNodeIsAnd(pAVar5);
          if (iVar3 != 0) {
            pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
            pAVar6 = Abc_ObjChild0Copy(pAVar5);
            pAVar7 = Abc_ObjChild1Copy(pAVar5);
            pAVar6 = Abc_AigAnd(pMan,pAVar6,pAVar7);
            (pAVar5->field_6).pCopy = pAVar6;
          }
        }
      }
      for (iVar10 = 0; iVar10 < pNtk->vPos->nSize; iVar10 = iVar10 + 1) {
        pAVar6 = Abc_NtkPo(pNtk,iVar10);
        pAVar5 = Abc_NtkDupObj(pNtk_00,pAVar6,0);
        pcVar4 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar5,pcVar4,Buffer_1);
        pAVar5 = (pAVar6->field_6).pCopy;
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Abc_ObjAddFanin(pAVar5,pAVar6);
      }
      for (iVar10 = 0; iVar3 = pNtk->vBoxes->nSize, iVar10 < iVar3; iVar10 = iVar10 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar10);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          pAVar6 = Abc_ObjChild0Copy((Abc_Obj_t *)
                                     pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
          (pAVar5->field_6).pCopy = pAVar6;
        }
      }
      for (iVar10 = 0; iVar10 < iVar3; iVar10 = iVar10 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar10);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
           ((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40) = pAVar5->field_6;
        }
        iVar3 = pNtk->vBoxes->nSize;
      }
      uVar8 = (ulong)(iVar2 + 1);
    }
    Extra_ProgressBarStop(p);
    if (fInitial == 0) {
      for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar2);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          ppvVar1 = pAVar5->pNtk->vObjs->pArray;
          Abc_ObjAddFanin(*(Abc_Obj_t **)((long)ppvVar1[*(pAVar5->vFanins).pArray] + 0x40),
                          *(Abc_Obj_t **)((long)ppvVar1[*(pAVar5->vFanouts).pArray] + 0x40));
        }
      }
    }
    Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
    Abc_NtkOrderCisCos(pNtk_00);
    iVar2 = Abc_NtkCheck(pNtk_00);
    if (iVar2 == 0) {
      puts("Abc_NtkFrames: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                ,0x311,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFrames( Abc_Ntk_t * pNtk, int nFrames, int fInitial, int fVerbose )
{
    char Buffer[1000];
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkFrames;
    Abc_Obj_t * pLatch, * pLatchOut;
    int i, Counter;
    assert( nFrames > 0 );
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );
    // start the new network
    pNtkFrames = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%d_frames", pNtk->pName, nFrames );
    pNtkFrames->pName = Extra_UtilStrsav(Buffer);
    // map the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkFrames);
    // create new latches (or their initial values) and remember them in the new latches
    if ( !fInitial )
    {
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Abc_NtkDupBox( pNtkFrames, pLatch, 1 );
    }
    else
    {
        Counter = 0;
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pLatchOut = Abc_ObjFanout0(pLatch);
            if ( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) ) // don't-care initial value - create a new PI
            {
                pLatchOut->pCopy = Abc_NtkCreatePi(pNtkFrames);
                Abc_ObjAssignName( pLatchOut->pCopy, Abc_ObjName(pLatchOut), NULL );
                Counter++;
            }
            else
                pLatchOut->pCopy = Abc_ObjNotCond( Abc_AigConst1(pNtkFrames), Abc_LatchIsInit0(pLatch) );
        }
        if ( Counter )
            printf( "Warning: %d uninitialized latches are replaced by free PI variables.\n", Counter );
    }
    
    // create the timeframes
    pProgress = Extra_ProgressBarStart( stdout, nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Abc_NtkAddFrame( pNtkFrames, pNtk, i );
    }
    Extra_ProgressBarStop( pProgress );
    
    // connect the new latches to the outputs of the last frame
    if ( !fInitial )
    {
        // we cannot use pLatch->pCopy here because pLatch->pCopy is used for temporary storage of strashed values
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pLatch)->pCopy, Abc_ObjFanout0(pLatch)->pCopy );
    }

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkFrames->pManFunc );
    // reorder the latches
    Abc_NtkOrderCisCos( pNtkFrames );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkFrames ) )
    {
        printf( "Abc_NtkFrames: The network check has failed.\n" );
        Abc_NtkDelete( pNtkFrames );
        return NULL;
    }
    return pNtkFrames;
}